

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

__m256i * paeth_pred(__m256i *left,__m256i *top,__m256i *topleft)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i *in_RAX;
  
  alVar1 = *top;
  alVar2 = *left;
  auVar4 = vpaddw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  alVar3 = *topleft;
  auVar6 = vpsubw_avx2(auVar4,(undefined1  [32])alVar3);
  auVar4 = vpsubw_avx2(auVar6,(undefined1  [32])alVar2);
  auVar4 = vpabsw_avx2(auVar4);
  auVar7 = vpsubw_avx2(auVar6,(undefined1  [32])alVar1);
  auVar7 = vpabsw_avx2(auVar7);
  auVar6 = vpsubw_avx2(auVar6,(undefined1  [32])alVar3);
  auVar6 = vpabsw_avx2(auVar6);
  auVar5 = vpminsw_avx2(auVar7,auVar6);
  auVar5 = vpcmpgtw_avx2(auVar4,auVar5);
  auVar4 = vpcmpgtw_avx2(auVar7,auVar6);
  auVar4 = vpblendvb_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar3,auVar4);
  auVar7 = vpandn_avx2(auVar5,(undefined1  [32])alVar2);
  auVar4 = vpand_avx2(auVar5,auVar4);
  vpor_avx2(auVar7,auVar4);
  return in_RAX;
}

Assistant:

static inline __m256i paeth_pred(const __m256i *left, const __m256i *top,
                                 const __m256i *topleft) {
  const __m256i base =
      _mm256_sub_epi16(_mm256_add_epi16(*top, *left), *topleft);

  __m256i pl = _mm256_abs_epi16(_mm256_sub_epi16(base, *left));
  __m256i pt = _mm256_abs_epi16(_mm256_sub_epi16(base, *top));
  __m256i ptl = _mm256_abs_epi16(_mm256_sub_epi16(base, *topleft));

  __m256i mask1 = _mm256_cmpgt_epi16(pl, pt);
  mask1 = _mm256_or_si256(mask1, _mm256_cmpgt_epi16(pl, ptl));
  __m256i mask2 = _mm256_cmpgt_epi16(pt, ptl);

  pl = _mm256_andnot_si256(mask1, *left);

  ptl = _mm256_and_si256(mask2, *topleft);
  pt = _mm256_andnot_si256(mask2, *top);
  pt = _mm256_or_si256(pt, ptl);
  pt = _mm256_and_si256(mask1, pt);

  return _mm256_or_si256(pt, pl);
}